

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *maxviol,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *sumviol)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  cpp_dec_float<100U,_int,_void> *pcVar5;
  ulong uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  activity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  cpp_dec_float<100U,_int,_void> local_198;
  cpp_dec_float<100U,_int,_void> *local_140;
  cpp_dec_float<100U,_int,_void> local_138;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_e8;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  local_140 = &sumviol->m_backend;
  if ((this->_hasSolReal != true) || (((this->_solReal).field_0xe0 & 1) == 0)) {
    if ((this->_hasSolRational != true) || (((this->_solRational).field_0xd0 & 1) == 0)) {
      return false;
    }
    if (this->_hasSolReal == false) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_e8,
               (this->_realLP->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->_realLP->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x46])(this->_realLP,&this->_solReal,&local_e8,1);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)local_140,0.0);
  uVar6 = (ulong)(this->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < (long)uVar6) {
    lVar4 = uVar6 * 0x50;
    do {
      iVar3 = (int)(uVar6 - 1);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_d0,this->_realLP,iVar3);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_80,this->_realLP,iVar3);
      pcVar5 = (cpp_dec_float<100U,_int,_void> *)
               ((long)local_e8.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems + lVar4)
      ;
      local_198.fpclass = cpp_dec_float_finite;
      local_198.prec_elem = 0x10;
      local_198.data._M_elems[0] = 0;
      local_198.data._M_elems[1] = 0;
      local_198.data._M_elems[2] = 0;
      local_198.data._M_elems[3] = 0;
      local_198.data._M_elems[4] = 0;
      local_198.data._M_elems[5] = 0;
      local_198.data._M_elems[6] = 0;
      local_198.data._M_elems[7] = 0;
      local_198.data._M_elems[8] = 0;
      local_198.data._M_elems[9] = 0;
      local_198.data._M_elems[10] = 0;
      local_198.data._M_elems[0xb] = 0;
      local_198.data._M_elems[0xc] = 0;
      local_198.data._M_elems[0xd] = 0;
      local_198.data._M_elems._56_5_ = 0;
      local_198.data._M_elems[0xf]._1_3_ = 0;
      local_198.exp = 0;
      local_198.neg = false;
      if (pcVar5 == &local_198) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_198,&local_d0);
        if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
          local_198.neg = (bool)(local_198.neg ^ 1);
          goto LAB_0049b5bb;
        }
LAB_0049b5c4:
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x10;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems._56_5_ = 0;
        local_138.data._M_elems[0xf]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_138,0.0);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_198,&local_138);
        if (0 < iVar3) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (local_140,&local_198);
          if (((local_198.fpclass != cpp_dec_float_NaN) &&
              ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_198,&maxviol->m_backend), 0 < iVar3)) {
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) =
                 local_198.data._M_elems._48_8_;
            *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
                 CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_198.data._M_elems._32_8_
            ;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) =
                 local_198.data._M_elems._40_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_198.data._M_elems._16_8_
            ;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_198.data._M_elems._24_8_
            ;
            *(undefined8 *)(maxviol->m_backend).data._M_elems = local_198.data._M_elems._0_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_198.data._M_elems._8_8_;
            (maxviol->m_backend).exp = local_198.exp;
            (maxviol->m_backend).neg = local_198.neg;
            (maxviol->m_backend).fpclass = local_198.fpclass;
            (maxviol->m_backend).prec_elem = local_198.prec_elem;
          }
        }
      }
      else {
        local_198.data._M_elems[0xc] = local_d0.data._M_elems[0xc];
        local_198.data._M_elems[0xd] = local_d0.data._M_elems[0xd];
        local_198.data._M_elems._56_5_ = local_d0.data._M_elems._56_5_;
        local_198.data._M_elems[0xf]._1_3_ = local_d0.data._M_elems[0xf]._1_3_;
        local_198.data._M_elems[8] = local_d0.data._M_elems[8];
        local_198.data._M_elems[9] = local_d0.data._M_elems[9];
        local_198.data._M_elems[10] = local_d0.data._M_elems[10];
        local_198.data._M_elems[0xb] = local_d0.data._M_elems[0xb];
        local_198.data._M_elems[4] = local_d0.data._M_elems[4];
        local_198.data._M_elems[5] = local_d0.data._M_elems[5];
        local_198.data._M_elems[6] = local_d0.data._M_elems[6];
        local_198.data._M_elems[7] = local_d0.data._M_elems[7];
        local_198.data._M_elems[0] = local_d0.data._M_elems[0];
        local_198.data._M_elems[1] = local_d0.data._M_elems[1];
        local_198.data._M_elems[2] = local_d0.data._M_elems[2];
        local_198.data._M_elems[3] = local_d0.data._M_elems[3];
        local_198.exp = local_d0.exp;
        local_198.neg = local_d0.neg;
        local_198.fpclass = local_d0.fpclass;
        local_198.prec_elem = local_d0.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_198,pcVar5);
LAB_0049b5bb:
        if (local_198.fpclass != cpp_dec_float_NaN) goto LAB_0049b5c4;
      }
      pcVar5 = (cpp_dec_float<100U,_int,_void> *)
               ((long)local_e8.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems + lVar4)
      ;
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      if (pcVar5 != &local_138) {
        local_138.data._M_elems._0_8_ = *(undefined8 *)(pcVar5->data)._M_elems;
        local_138.data._M_elems._8_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 2);
        local_138.data._M_elems._16_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 4);
        local_138.data._M_elems._24_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 6);
        local_138.data._M_elems._32_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 8);
        local_138.data._M_elems._40_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 10);
        local_138.data._M_elems._48_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 0xc);
        uVar2 = *(undefined8 *)((pcVar5->data)._M_elems + 0xe);
        local_138.data._M_elems._56_5_ = SUB85(uVar2,0);
        local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_138.exp =
             *(int *)((long)(&local_e8.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                     lVar4);
        local_138.neg =
             *(bool *)((long)(&local_e8.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) +
                      lVar4 + 4);
        local_138._72_8_ =
             *(undefined8 *)
              ((long)(&local_e8.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) + lVar4 + 8
              );
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_138,&local_80);
      local_198.data._M_elems[0xc] = local_138.data._M_elems[0xc];
      local_198.data._M_elems[0xd] = local_138.data._M_elems[0xd];
      local_198.data._M_elems._56_5_ = local_138.data._M_elems._56_5_;
      local_198.data._M_elems[0xf]._1_3_ = local_138.data._M_elems[0xf]._1_3_;
      local_198.data._M_elems[8] = local_138.data._M_elems[8];
      local_198.data._M_elems[9] = local_138.data._M_elems[9];
      local_198.data._M_elems[10] = local_138.data._M_elems[10];
      local_198.data._M_elems[0xb] = local_138.data._M_elems[0xb];
      local_198.data._M_elems[4] = local_138.data._M_elems[4];
      local_198.data._M_elems[5] = local_138.data._M_elems[5];
      local_198.data._M_elems[6] = local_138.data._M_elems[6];
      local_198.data._M_elems[7] = local_138.data._M_elems[7];
      local_198.data._M_elems[0] = local_138.data._M_elems[0];
      local_198.data._M_elems[1] = local_138.data._M_elems[1];
      local_198.data._M_elems[2] = local_138.data._M_elems[2];
      local_198.data._M_elems[3] = local_138.data._M_elems[3];
      local_198.exp = local_138.exp;
      local_198.neg = local_138.neg;
      local_198.fpclass = local_138.fpclass;
      local_198.prec_elem = local_138.prec_elem;
      if (local_138.fpclass != cpp_dec_float_NaN) {
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x10;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems._56_5_ = 0;
        local_138.data._M_elems[0xf]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_138,0.0);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_198,&local_138);
        if (0 < iVar3) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (local_140,&local_198);
          if (((local_198.fpclass != cpp_dec_float_NaN) &&
              ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_198,&maxviol->m_backend), 0 < iVar3)) {
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) =
                 local_198.data._M_elems._48_8_;
            *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
                 CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_198.data._M_elems._32_8_
            ;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) =
                 local_198.data._M_elems._40_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_198.data._M_elems._16_8_
            ;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_198.data._M_elems._24_8_
            ;
            *(undefined8 *)(maxviol->m_backend).data._M_elems = local_198.data._M_elems._0_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_198.data._M_elems._8_8_;
            (maxviol->m_backend).exp = local_198.exp;
            (maxviol->m_backend).neg = local_198.neg;
            (maxviol->m_backend).fpclass = local_198.fpclass;
            (maxviol->m_backend).prec_elem = local_198.prec_elem;
          }
        }
      }
      bVar1 = 1 < uVar6;
      uVar6 = uVar6 - 1;
      lVar4 = lVar4 + -0x50;
    } while (bVar1);
  }
  if (local_e8.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}